

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIB.cpp
# Opt level: O1

void __thiscall Storage::Disk::NIB::NIB(NIB *this,string *file_name)

{
  FileHolder *this_00;
  uint8_t uVar1;
  bool bVar2;
  stat *psVar3;
  undefined4 *puVar4;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__NIB_005aa770;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  this->cached_offset_ = 0;
  (this->cached_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->cached_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar3 = FileHolder::stats(this_00);
  if (psVar3->st_size != 0x38e00) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0xfffffffe;
    __cxa_throw(puVar4,&Error::typeinfo,0);
  }
  do {
    uVar1 = FileHolder::get8(this_00);
    bVar2 = FileHolder::eof(this_00);
    if (-1 < (char)uVar1 && !bVar2) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xfffffffe;
      __cxa_throw(puVar4,&Error::typeinfo,0);
    }
  } while (!bVar2);
  return;
}

Assistant:

NIB::NIB(const std::string &file_name) :
	file_(file_name) {
	// A NIB should be 35 tracks, each 6656 bytes long.
	if(file_.stats().st_size != track_length*number_of_tracks) {
		throw Error::InvalidFormat;
	}

	// A real NIB should have every single top bit set. Yes, 1/8th of the
	// file size is a complete waste. But it provides a hook for validation.
	while(true) {
		uint8_t next = file_.get8();
		if(file_.eof()) break;
		if(!(next & 0x80)) throw Error::InvalidFormat;
	}
}